

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_state.cpp
# Opt level: O2

void __thiscall ccs::SearchState::SearchState(SearchState *this,shared_ptr<const_ccs::Node> *root)

{
  _Rb_tree_header *p_Var1;
  Specificity local_38;
  
  std::__shared_ptr<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2> *)this,
             &root->super___shared_ptr<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2>);
  (this->parent).super___shared_ptr<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->parent).super___shared_ptr<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = &(this->nodes)._M_t._M_impl.super__Rb_tree_header;
  (this->nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->nodes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->tallyMap)._M_t._M_impl.super__Rb_tree_header;
  (this->tallyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->tallyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->tallyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->tallyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->tallyMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->properties)._M_t._M_impl.super__Rb_tree_header;
  (this->properties)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->properties)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->properties)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->properties)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->properties)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->tracer = (((root->super___shared_ptr<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 tracer_).super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = &(this->key).values_._M_t._M_impl.super__Rb_tree_header;
  (this->key).values_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->key).values_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->key).values_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->key).values_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->key).values_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->key).specificity_.names = 0;
  (this->key).specificity_.values = 0;
  this->constraintsChanged = false;
  local_38.names = 0;
  local_38.values = 0;
  Node::activate((root->super___shared_ptr<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 &local_38,this);
  while (this->constraintsChanged == true) {
    this->constraintsChanged = false;
    local_38.names = 0;
    local_38.values = 0;
    Node::getChildren((root->super___shared_ptr<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      ,&this->key,&local_38,this);
  }
  return;
}

Assistant:

SearchState::SearchState(std::shared_ptr<const Node> &root) :
      root(root), tracer(root->tracer()) {
  constraintsChanged = false;
  root->activate(Specificity(), *this);
  while (constraintsChanged) {
    constraintsChanged = false;
    root->getChildren(key, Specificity(), *this);
  }
}